

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O0

int mg_session_read_node(mg_session *session,mg_node **node)

{
  int iVar1;
  mg_node *pmVar2;
  mg_session *in_RSI;
  mg_session *in_RDI;
  uint32_t i_1;
  uint32_t i;
  int status;
  mg_node *tnode;
  int status_3;
  uint32_t label_count;
  int status_2;
  int64_t id;
  int status_1;
  mg_allocator *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb4;
  undefined2 uVar3;
  uint8_t in_stack_ffffffffffffffb6;
  undefined1 uVar4;
  uint8_t in_stack_ffffffffffffffb7;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar6;
  undefined4 in_stack_ffffffffffffffbc;
  mg_allocator *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  mg_session *in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = mg_session_check_struct_header
                      ((mg_session *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb6);
  if (((local_4 == 0) &&
      (iVar1 = mg_session_read_integer(in_RSI,(int64_t *)(ulong)in_stack_ffffffffffffffe0),
      local_4 = iVar1, iVar1 == 0)) &&
     (local_4 = mg_session_read_container_size
                          (in_stack_ffffffffffffffd8,(uint32_t *)(ulong)in_stack_ffffffffffffffd0,
                           (uint8_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))
     , local_4 == 0)) {
    pmVar2 = mg_node_alloc(0,in_stack_ffffffffffffffc0);
    if (pmVar2 == (mg_node *)0x0) {
      mg_session_set_error(in_RDI,"out of memory");
      local_4 = -3;
    }
    else {
      pmVar2->id = (int64_t)in_stack_ffffffffffffffd8;
      pmVar2->label_count = 0;
      for (uVar6 = 0; uVar6 < in_stack_ffffffffffffffd0; uVar6 = uVar6 + 1) {
        local_4 = mg_session_read_string
                            ((mg_session *)(ulong)uVar6,
                             (mg_string **)
                             CONCAT17(in_stack_ffffffffffffffb7,
                                      CONCAT16(in_stack_ffffffffffffffb6,
                                               CONCAT24(in_stack_ffffffffffffffb4,
                                                        in_stack_ffffffffffffffb0))));
        if (local_4 != 0) goto LAB_00108f8b;
        pmVar2->label_count = pmVar2->label_count + 1;
      }
      local_4 = mg_session_read_map(in_stack_ffffffffffffffd8,
                                    (mg_map **)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
      if (local_4 == 0) {
        *(mg_node **)in_RSI = pmVar2;
        local_4 = 0;
      }
      else {
LAB_00108f8b:
        uVar3 = 0;
        uVar4 = 0;
        uVar5 = 0;
        while (CONCAT13(uVar5,CONCAT12(uVar4,uVar3)) < pmVar2->label_count) {
          mg_string_destroy_ca
                    ((mg_string *)
                     CONCAT17(uVar5,CONCAT16(uVar4,CONCAT24(uVar3,in_stack_ffffffffffffffb0))),
                     in_stack_ffffffffffffffa8);
          iVar1 = CONCAT13(uVar5,CONCAT12(uVar4,uVar3)) + 1;
          uVar3 = (undefined2)iVar1;
          uVar4 = (undefined1)((uint)iVar1 >> 0x10);
          uVar5 = (undefined1)((uint)iVar1 >> 0x18);
        }
        mg_allocator_free((mg_allocator *)
                          CONCAT17(uVar5,CONCAT16(uVar4,CONCAT24(uVar3,in_stack_ffffffffffffffb0))),
                          in_stack_ffffffffffffffa8);
      }
    }
  }
  return local_4;
}

Assistant:

int mg_session_read_node(mg_session *session, mg_node **node) {
  MG_RETURN_IF_FAILED(mg_session_check_struct_header(
      session, (uint8_t)(MG_MARKER_TINY_STRUCT + 3), MG_SIGNATURE_NODE));

  int64_t id;
  MG_RETURN_IF_FAILED(mg_session_read_integer(session, &id));

  uint32_t label_count;
  MG_RETURN_IF_FAILED(
      mg_session_read_container_size(session, &label_count, MG_MARKERS_LIST));

  mg_node *tnode = mg_node_alloc(label_count, session->decoder_allocator);
  if (!tnode) {
    mg_session_set_error(session, "out of memory");
    return MG_ERROR_OOM;
  }

  int status = 0;

  tnode->id = id;
  tnode->label_count = 0;
  for (uint32_t i = 0; i < label_count; ++i) {
    status = mg_session_read_string(session, &tnode->labels[i]);
    if (status != 0) {
      goto cleanup;
    }
    tnode->label_count++;
  }

  status = mg_session_read_map(session, &tnode->properties);
  if (status != 0) {
    goto cleanup;
  }

  *node = tnode;

  return 0;

cleanup:
  for (uint32_t i = 0; i < tnode->label_count; ++i) {
    mg_string_destroy_ca(tnode->labels[i], session->decoder_allocator);
  }
  mg_allocator_free(session->decoder_allocator, tnode);
  return status;
}